

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP4Reader::Init(BP4Reader *this)

{
  float fVar1;
  float fVar2;
  IO *pIVar3;
  _func_int *p_Var4;
  TimePoint TVar5;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  pointer local_e8;
  pointer local_e0;
  Seconds timeoutSeconds;
  TimePoint timeoutInstant;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  if ((this->super_Engine).m_OpenMode != Read) {
    std::__cxx11::string::string((string *)&timeoutSeconds,"Engine",&local_e9);
    std::__cxx11::string::string((string *)&local_98,"BP4Reader",&local_ea);
    std::__cxx11::string::string((string *)&timeoutInstant,"Init",&local_eb);
    std::operator+(&local_78,"BPFileReader only supports OpenMode::Read from",
                   &(this->super_Engine).m_Name);
    helper::Throw<std::invalid_argument>
              ((string *)&timeoutSeconds,&local_98,(string *)&timeoutInstant,&local_78,-1);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&timeoutInstant);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&timeoutSeconds);
  }
  pIVar3 = (this->super_Engine).m_IO;
  pIVar3->m_ReadStreaming = false;
  p_Var4 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
  std::__cxx11::string::string
            ((string *)&local_38,"in call to BP4::Open to write",(allocator *)&timeoutSeconds);
  std::__cxx11::string::string((string *)&local_58,"",(allocator *)&local_98);
  adios2::format::BPBase::Init
            ((BPBase *)(p_Var4 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),
             &pIVar3->m_Parameters,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (*(this->super_Engine)._vptr_Engine[0x17])(this);
  helper::RaiseLimitNoFile();
  if (this->readMetadataFromFile == true) {
    p_Var4 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
    fVar1 = *(float *)(p_Var4 + 0x224 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer);
    local_e0 = (pointer)(double)fVar1;
    fVar2 = *(float *)(p_Var4 + 0x228 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer);
    local_e8 = local_e0;
    if (fVar2 <= fVar1) {
      local_e8 = (pointer)(double)fVar2;
    }
    timeoutSeconds.__r = (rep_conflict)local_e0;
    local_98._M_dataplus._M_p = local_e8;
    TVar5 = Now();
    timeoutInstant.__d.__r = (duration)((double)local_e0 * 1000000000.0 + (double)TVar5.__d.__r);
    OpenFiles(this,&timeoutInstant,(Seconds *)&local_98,&timeoutSeconds);
    if (((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x268)
        [(long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer] == (_func_int)0x0) {
      local_78._M_dataplus._M_p = (pointer)(local_e8 / 10.0);
      InitBuffer(this,&timeoutInstant,(Seconds *)&local_78,&timeoutSeconds);
    }
  }
  return;
}

Assistant:

void BP4Reader::Init()
{
    if (m_OpenMode != Mode::Read)
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "Init",
                                             "BPFileReader only "
                                             "supports OpenMode::Read from" +
                                                 m_Name);
    }
    // if IO was involved in reading before this flag may be true now
    m_IO.m_ReadStreaming = false;

    m_BP4Deserializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    InitTransports();

    helper::RaiseLimitNoFile();
    if (readMetadataFromFile)
    {
        /* Do a collective wait for the file(s) to appear within timeout.
           Make sure every process comes to the same conclusion */
        const Seconds timeoutSeconds(m_BP4Deserializer.m_Parameters.OpenTimeoutSecs);

        Seconds pollSeconds(m_BP4Deserializer.m_Parameters.BeginStepPollingFrequencySecs);
        if (pollSeconds > timeoutSeconds)
        {
            pollSeconds = timeoutSeconds;
        }

        TimePoint timeoutInstant = Now() + timeoutSeconds;

        OpenFiles(timeoutInstant, pollSeconds, timeoutSeconds);
        if (!m_BP4Deserializer.m_Parameters.StreamReader)
        {
            /* non-stream reader gets as much steps as available now */
            InitBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
        }
    }
}